

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void set_local_option(Curl_easy *data,int option,int newstate)

{
  TELNET *pTVar1;
  TELNET *tn;
  int newstate_local;
  int option_local;
  Curl_easy *data_local;
  
  pTVar1 = (data->req).p.telnet;
  if (newstate == 1) {
    switch(pTVar1->us[option]) {
    case 0:
      pTVar1->us[option] = 2;
      send_negotiation(data,0xfb,option);
      break;
    case 1:
      break;
    case 2:
      if ((pTVar1->usq[option] != 0) && (pTVar1->usq[option] == 1)) {
        pTVar1->usq[option] = 0;
      }
      break;
    case 3:
      if (pTVar1->usq[option] == 0) {
        pTVar1->usq[option] = 1;
      }
    }
  }
  else {
    switch(pTVar1->us[option]) {
    case 0:
      break;
    case 1:
      pTVar1->us[option] = 3;
      send_negotiation(data,0xfc,option);
      break;
    case 2:
      if (pTVar1->usq[option] == 0) {
        pTVar1->usq[option] = 1;
      }
      break;
    case 3:
      if ((pTVar1->usq[option] != 0) && (pTVar1->usq[option] == 1)) {
        pTVar1->usq[option] = 0;
      }
    }
  }
  return;
}

Assistant:

static void
set_local_option(struct Curl_easy *data, int option, int newstate)
{
  struct TELNET *tn = data->req.p.telnet;
  if(newstate == CURL_YES) {
    switch(tn->us[option]) {
    case CURL_NO:
      tn->us[option] = CURL_WANTYES;
      send_negotiation(data, CURL_WILL, option);
      break;

    case CURL_YES:
      /* Already enabled */
      break;

    case CURL_WANTNO:
      switch(tn->usq[option]) {
      case CURL_EMPTY:
        /* Already negotiating for CURL_YES, queue the request */
        tn->usq[option] = CURL_OPPOSITE;
        break;
      case CURL_OPPOSITE:
        /* Error: already queued an enable request */
        break;
      }
      break;

    case CURL_WANTYES:
      switch(tn->usq[option]) {
      case CURL_EMPTY:
        /* Error: already negotiating for enable */
        break;
      case CURL_OPPOSITE:
        tn->usq[option] = CURL_EMPTY;
        break;
      }
      break;
    }
  }
  else { /* NO */
    switch(tn->us[option]) {
    case CURL_NO:
      /* Already disabled */
      break;

    case CURL_YES:
      tn->us[option] = CURL_WANTNO;
      send_negotiation(data, CURL_WONT, option);
      break;

    case CURL_WANTNO:
      switch(tn->usq[option]) {
      case CURL_EMPTY:
        /* Already negotiating for NO */
        break;
      case CURL_OPPOSITE:
        tn->usq[option] = CURL_EMPTY;
        break;
      }
      break;

    case CURL_WANTYES:
      switch(tn->usq[option]) {
      case CURL_EMPTY:
        tn->usq[option] = CURL_OPPOSITE;
        break;
      case CURL_OPPOSITE:
        break;
      }
      break;
    }
  }
}